

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ball.c
# Opt level: O0

void ballfall(void)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  int local_10;
  int dmg;
  boolean gets_hit;
  
  if ((uball->ox != u.ux) || (bVar4 = false, uball->oy != u.uy)) {
    if (uwep == uball) {
      cVar1 = '\0';
    }
    else {
      iVar2 = rn2(5);
      cVar1 = (char)iVar2;
    }
    bVar4 = cVar1 != '\0';
  }
  if (uball->where == '\x03') {
    pline("Startled, you drop the iron ball.");
    if (uwep == uball) {
      setuwep((obj *)0x0);
    }
    if (uswapwep == uball) {
      setuswapwep((obj *)0x0);
    }
    if (uquiver == uball) {
      setuqwep((obj *)0x0);
    }
    if (uwep != uball) {
      freeinv(uball);
    }
  }
  if (bVar4) {
    local_10 = rn2(7);
    local_10 = local_10 + 0x19;
    pcVar3 = body_part(8);
    pline("The iron ball falls on your %s.",pcVar3);
    if (uarmh != (obj *)0x0) {
      if (((*(ushort *)&objects[uarmh->otyp].field_0x11 >> 4 & 0x1f) < 0xb) ||
         (0x11 < (*(ushort *)&objects[uarmh->otyp].field_0x11 >> 4 & 0x1f))) {
        if (flags.verbose != '\0') {
          pcVar3 = xname(uarmh);
          pline("Your %s does not protect you.",pcVar3);
        }
      }
      else {
        pline("Fortunately, you are wearing a hard helmet.");
        local_10 = 3;
      }
    }
    losehp(local_10,"crunched in the head by an iron ball",2);
  }
  return;
}

Assistant:

void ballfall(void)
{
	boolean gets_hit;

	gets_hit = (((uball->ox != u.ux) || (uball->oy != u.uy)) &&
		    ((uwep == uball)? FALSE : (boolean)rn2(5)));
	if (carried(uball)) {
		pline("Startled, you drop the iron ball.");
		if (uwep == uball)
			setuwep(NULL);
		if (uswapwep == uball)
			setuswapwep(NULL);
		if (uquiver == uball)
			setuqwep(NULL);;
		if (uwep != uball)
			freeinv(uball);
	}
	if (gets_hit){
		int dmg = rn1(7,25);
		pline("The iron ball falls on your %s.",
			body_part(HEAD));
		if (uarmh) {
		    if (is_metallic(uarmh)) {
			pline("Fortunately, you are wearing a hard helmet.");
			dmg = 3;
		    } else if (flags.verbose)
			pline("Your %s does not protect you.", xname(uarmh));
		}
		losehp(dmg, "crunched in the head by an iron ball",
			NO_KILLER_PREFIX);
	}
}